

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

XrSdkSessionLabelPtr __thiscall
XrSdkSessionLabel::make(XrSdkSessionLabel *this,XrDebugUtilsLabelEXT *label_info,bool individual)

{
  XrSdkSessionLabel *this_00;
  
  this_00 = (XrSdkSessionLabel *)operator_new(0x40);
  XrSdkSessionLabel(this_00,label_info,individual);
  (this->label_name)._M_dataplus._M_p = (pointer)this_00;
  return (__uniq_ptr_data<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>,_true,_true>)
         (__uniq_ptr_data<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>,_true,_true>)
         this;
}

Assistant:

XrSdkSessionLabelPtr XrSdkSessionLabel::make(const XrDebugUtilsLabelEXT& label_info, bool individual) {
    XrSdkSessionLabelPtr ret(new XrSdkSessionLabel(label_info, individual));
    return ret;
}